

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThreadPool.cpp
# Opt level: O2

void __thiscall
IlmThread_3_4::anon_unknown_5::DefaultThreadPoolProvider::threadLoop
          (DefaultThreadPoolProvider *this,
          shared_ptr<IlmThread_3_4::(anonymous_namespace)::DefaultThreadPoolData> *data)

{
  element_type *peVar1;
  pointer ppTVar2;
  Task *task;
  mutex *__m;
  unique_lock<std::mutex> taskLock;
  unique_lock<std::mutex> uStack_28;
  
  __m = (mutex *)data;
  do {
    Semaphore::wait(&((data->
                      super___shared_ptr<IlmThread_3_4::(anonymous_namespace)::DefaultThreadPoolData,_(__gnu_cxx::_Lock_policy)2>
                      )._M_ptr)->_taskSemaphore,__m);
    __m = &((data->
            super___shared_ptr<IlmThread_3_4::(anonymous_namespace)::DefaultThreadPoolData,_(__gnu_cxx::_Lock_policy)2>
            )._M_ptr)->_taskMutex;
    std::unique_lock<std::mutex>::unique_lock(&uStack_28,__m);
    peVar1 = (data->
             super___shared_ptr<IlmThread_3_4::(anonymous_namespace)::DefaultThreadPoolData,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr;
    ppTVar2 = (peVar1->_tasks).
              super__Vector_base<IlmThread_3_4::Task_*,_std::allocator<IlmThread_3_4::Task_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if ((peVar1->_tasks).
        super__Vector_base<IlmThread_3_4::Task_*,_std::allocator<IlmThread_3_4::Task_*>_>._M_impl.
        super__Vector_impl_data._M_start == ppTVar2) {
      if (((peVar1->_stopping)._M_base._M_i & 1U) != 0) {
        std::unique_lock<std::mutex>::~unique_lock(&uStack_28);
        return;
      }
    }
    else {
      task = ppTVar2[-1];
      (peVar1->_tasks).
      super__Vector_base<IlmThread_3_4::Task_*,_std::allocator<IlmThread_3_4::Task_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppTVar2 + -1;
      std::unique_lock<std::mutex>::unlock(&uStack_28);
      handleProcessTask(task);
    }
    std::unique_lock<std::mutex>::~unique_lock(&uStack_28);
  } while( true );
}

Assistant:

void
DefaultThreadPoolProvider::threadLoop (
    std::shared_ptr<DefaultThreadPoolData> data)
{
    while (true)
    {
        //
        // Wait for a task to become available
        //

        data->_taskSemaphore.wait ();

        {
            std::unique_lock<std::mutex> taskLock (data->_taskMutex);

            //
            // If there is a task pending, pop off the next task in the FIFO
            //

            if (!data->_tasks.empty ())
            {
                Task* task = data->_tasks.back ();
                data->_tasks.pop_back ();

                // release the mutex while we process
                taskLock.unlock ();

                handleProcessTask (task);

                // do not need to reacquire the lock at all since we
                // will just loop around, pull any other task
            }
            else if (data->stopped ()) { break; }
        }
    }
}